

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack27_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x7ffffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1b;
  out[1] = uVar1 >> 0x1b | (uVar2 & 0x3fffff) << 5;
  out[2] = uVar2 >> 0x16;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x16 | (uVar1 & 0x1ffff) << 10;
  out[3] = uVar1 >> 0x11;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x11 | (uVar2 & 0xfff) << 0xf;
  uVar1 = in[4];
  out[4] = uVar2 >> 0xc;
  out[4] = uVar2 >> 0xc | (uVar1 & 0x7f) << 0x14;
  out[5] = uVar1 >> 7;
  uVar2 = in[5];
  out[5] = uVar1 >> 7 | (uVar2 & 3) << 0x19;
  out[6] = uVar2 >> 2 & 0x7ffffff;
  uVar1 = in[6];
  out[7] = uVar2 >> 0x1d;
  out[7] = uVar2 >> 0x1d | (uVar1 & 0xffffff) << 3;
  out[8] = uVar1 >> 0x18;
  uVar2 = in[7];
  uVar3 = in[8];
  out[8] = uVar1 >> 0x18 | (uVar2 & 0x7ffff) << 8;
  out[9] = uVar2 >> 0x13;
  out[9] = uVar2 >> 0x13 | (uVar3 & 0x3fff) << 0xd;
  uVar1 = in[9];
  out[10] = uVar3 >> 0xe;
  out[10] = uVar3 >> 0xe | (uVar1 & 0x1ff) << 0x12;
  out[0xb] = uVar1 >> 9;
  uVar2 = in[10];
  out[0xb] = uVar1 >> 9 | (uVar2 & 0xf) << 0x17;
  out[0xc] = uVar2 >> 4 & 0x7ffffff;
  out[0xd] = uVar2 >> 0x1f;
  uVar1 = in[0xb];
  out[0xd] = uVar2 >> 0x1f | (uVar1 & 0x3ffffff) << 1;
  out[0xe] = uVar1 >> 0x1a;
  uVar2 = in[0xc];
  out[0xe] = uVar1 >> 0x1a | (uVar2 & 0x1fffff) << 6;
  uVar1 = in[0xd];
  out[0xf] = uVar2 >> 0x15;
  out[0xf] = (uVar1 & 0xffff) << 0xb | uVar2 >> 0x15;
  return in + 0xe;
}

Assistant:

const uint32_t *__fastunpack27_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;

  return in + 1;
}